

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::wait_op>::~op_queue(op_queue<asio::detail::wait_op> *this)

{
  noncopyable *in_RDI;
  wait_op *op;
  
  while (*(op_queue<asio::detail::wait_op> **)in_RDI != (op_queue<asio::detail::wait_op> *)0x0) {
    pop(*(op_queue<asio::detail::wait_op> **)in_RDI);
    op_queue_access::destroy<asio::detail::wait_op>((wait_op *)0x54569b);
  }
  noncopyable::~noncopyable(in_RDI);
  return;
}

Assistant:

~op_queue()
  {
    while (Operation* op = front_)
    {
      pop();
      op_queue_access::destroy(op);
    }
  }